

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroupPrivate::animationRemoved
          (QSequentialAnimationGroupPrivate *this,qsizetype index,QAbstractAnimation *anim)

{
  QBindingStorage *this_00;
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *data;
  int *piVar1;
  int iVar2;
  QObject *pQVar3;
  QBindingStatus *pQVar4;
  int iVar5;
  parameter_type pVar6;
  int iVar7;
  qsizetype qVar8;
  ulong uVar9;
  
  pQVar3 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.q_ptr;
  QAnimationGroupPrivate::animationRemoved(&this->super_QAnimationGroupPrivate,index,anim);
  data = &this->currentAnimation;
  this_00 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage;
  pQVar4 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar4 != (QBindingStatus *)0x0) &&
     (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  if ((data->super_QPropertyData<QAbstractAnimation_*>).val == (QAbstractAnimation *)0x0) {
    return;
  }
  if (index < (this->actualDuration).d.size) {
    QList<int>::removeAt(&this->actualDuration,index);
  }
  qVar8 = QtPrivate::
          indexOf<QAbstractAnimation_*,_QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>_>
                    (&(this->super_QAnimationGroupPrivate).animations,data,0);
  if (qVar8 != -1) {
    if (index < this->currentAnimationIndex) {
      this->currentAnimationIndex = this->currentAnimationIndex + -1;
    }
    goto LAB_003baee8;
  }
  pQVar4 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar4 != (QBindingStatus *)0x0) &&
     (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
  }
  QObject::disconnect(&((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)->
                       super_QObject,(char *)0x0,
                      (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                      super_QObjectPrivate.super_QObjectData.q_ptr,
                      "1_q_uncontrolledAnimationFinished()");
  if (index < (this->super_QAnimationGroupPrivate).animations.d.size) {
LAB_003baedc:
    iVar5 = (int)index;
  }
  else {
    if (0 < index) {
      index = (qsizetype)((int)index - 1);
      goto LAB_003baedc;
    }
    iVar5 = -1;
  }
  setCurrentAnimation(this,iVar5,false);
LAB_003baee8:
  (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = 0;
  if (0 < this->currentAnimationIndex) {
    uVar9 = 0;
    do {
      iVar5 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[uVar9]);
      if ((iVar5 == -1) && (iVar5 = -1, uVar9 < (ulong)(this->actualDuration).d.size)) {
        iVar5 = (this->actualDuration).d.ptr[uVar9];
      }
      piVar1 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
      *piVar1 = *piVar1 + iVar5;
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)this->currentAnimationIndex);
  }
  if (qVar8 != -1) {
    pQVar4 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
             super_QObjectPrivate.super_QObjectData.bindingStorage.bindingStatus;
    if ((pQVar4 != (QBindingStatus *)0x0) &&
       (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
      QBindingStorage::registerDependency_helper(this_00,(QUntypedPropertyData *)data);
    }
    pVar6 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
            ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                     *)&(((this->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val)->
                        super_QObject).d_ptr.d[1].field_0x30);
    piVar1 = &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
    *piVar1 = *piVar1 + pVar6;
  }
  iVar5 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
  pQVar4 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.super_QObjectPrivate
           .super_QObjectData.bindingStorage.bindingStatus;
  if ((pQVar4 != (QBindingStatus *)0x0) &&
     (pQVar4->currentlyEvaluatingBinding != (BindingEvaluationState *)0x0)) {
    QBindingStorage::registerDependency_helper
              (this_00,(QUntypedPropertyData *)
                       &(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.
                        loopCount);
  }
  iVar2 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.loopCount.
          super_QPropertyData<int>.val;
  iVar7 = (*pQVar3->_vptr_QObject[0xc])(pQVar3);
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
  ::setValue(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.totalCurrentTime,
             iVar2 * iVar7 + iVar5);
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::animationRemoved(qsizetype index, QAbstractAnimation *anim)
{
    Q_Q(QSequentialAnimationGroup);
    QAnimationGroupPrivate::animationRemoved(index, anim);

    if (!currentAnimation)
        return;

    if (actualDuration.size() > index)
        actualDuration.removeAt(index);

    const qsizetype currentIndex = animations.indexOf(currentAnimation);
    if (currentIndex == -1) {
        //we're removing the current animation

        disconnectUncontrolledAnimation(currentAnimation);

        if (index < animations.size())
            setCurrentAnimation(index); //let's try to take the next one
        else if (index > 0)
            setCurrentAnimation(index - 1);
        else// case all animations were removed
            setCurrentAnimation(-1);
    } else if (currentAnimationIndex > index) {
        currentAnimationIndex--;
    }

    // duration of the previous animations up to the current animation
    currentTime = 0;
    for (qsizetype i = 0; i < currentAnimationIndex; ++i) {
        const int current = animationActualTotalDuration(i);
        currentTime += current;
    }

    if (currentIndex != -1) {
        //the current animation is not the one being removed
        //so we add its current time to the current time of this group
        currentTime += QAbstractAnimationPrivate::get(currentAnimation)->totalCurrentTime;
    }

    //let's also update the total current time
    totalCurrentTime = currentTime + loopCount * q->duration();
}